

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O3

int Curl_pp_getsock(pingpong *pp,curl_socket_t *socks,int numsocks)

{
  int iVar1;
  
  if (numsocks != 0) {
    *socks = pp->conn->sock[0];
    iVar1 = 0x10000;
    if (pp->sendleft == 0) {
      iVar1 = 1;
    }
    return iVar1;
  }
  return 0;
}

Assistant:

int Curl_pp_getsock(struct pingpong *pp,
                    curl_socket_t *socks,
                    int numsocks)
{
  struct connectdata *conn = pp->conn;

  if(!numsocks)
    return GETSOCK_BLANK;

  socks[0] = conn->sock[FIRSTSOCKET];

  if(pp->sendleft) {
    /* write mode */
    return GETSOCK_WRITESOCK(0);
  }

  /* read mode */
  return GETSOCK_READSOCK(0);
}